

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

void __thiscall
slang::ast::Expression::getLongestStaticPrefixes
          (Expression *this,
          SmallVector<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>,_2UL>
          *results,EvalContext *evalContext,Expression *longestStaticPrefix)

{
  Expression *pEVar1;
  Expression *pEVar2;
  bool bVar3;
  long lVar4;
  
  do {
    switch((((RangeSelectExpression *)this)->super_Expression).kind) {
    case NamedValue:
    case HierarchicalValue:
      ValueExpressionBase::getLongestStaticPrefixesImpl
                ((ValueExpressionBase *)this,results,longestStaticPrefix);
      return;
    default:
      return;
    case Concatenation:
      bVar3 = Type::isIntegral((((RangeSelectExpression *)this)->super_Expression).type.ptr);
      if (!bVar3) {
        return;
      }
      pEVar1 = ((RangeSelectExpression *)this)->value_;
      pEVar2 = ((RangeSelectExpression *)this)->left_;
      for (lVar4 = 0; (long)pEVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
        getLongestStaticPrefixes
                  (*(Expression **)((long)&pEVar1->kind + lVar4),results,evalContext,
                   (Expression *)0x0);
      }
      return;
    case Streaming:
      pEVar1 = ((RangeSelectExpression *)this)->value_;
      pEVar2 = ((RangeSelectExpression *)this)->left_;
      for (lVar4 = 0; (long)pEVar2 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
        getLongestStaticPrefixes
                  (*(Expression **)((long)&pEVar1->kind + lVar4),results,evalContext,
                   (Expression *)0x0);
      }
      return;
    case ElementSelect:
      ElementSelectExpression::getLongestStaticPrefixesImpl
                ((ElementSelectExpression *)this,results,evalContext,longestStaticPrefix);
      return;
    case RangeSelect:
      RangeSelectExpression::getLongestStaticPrefixesImpl
                ((RangeSelectExpression *)this,results,evalContext,longestStaticPrefix);
      return;
    case MemberAccess:
      MemberAccessExpression::getLongestStaticPrefixesImpl
                ((MemberAccessExpression *)this,results,evalContext,longestStaticPrefix);
      return;
    case Conversion:
      if (1 < *(int *)&((RangeSelectExpression *)this)->value_) {
        return;
      }
      this = ((RangeSelectExpression *)this)->left_;
    }
  } while( true );
}

Assistant:

void Expression::getLongestStaticPrefixes(
    SmallVector<std::pair<const ValueSymbol*, const Expression*>>& results,
    EvalContext& evalContext, const Expression* longestStaticPrefix) const {

    switch (kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue: {
            auto& ve = as<ValueExpressionBase>();
            ve.getLongestStaticPrefixesImpl(results, longestStaticPrefix);
            break;
        }
        case ExpressionKind::ElementSelect: {
            auto& select = as<ElementSelectExpression>();
            select.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::RangeSelect: {
            auto& select = as<RangeSelectExpression>();
            select.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::MemberAccess: {
            auto& access = as<MemberAccessExpression>();
            access.getLongestStaticPrefixesImpl(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            if (concat.type->isIntegral()) {
                for (auto op : concat.operands())
                    op->getLongestStaticPrefixes(results, evalContext, nullptr);
            }
            break;
        }
        case ExpressionKind::Streaming: {
            SLANG_ASSERT(!longestStaticPrefix);
            auto& stream = as<StreamingConcatenationExpression>();
            for (auto& op : stream.streams())
                op.operand->getLongestStaticPrefixes(results, evalContext, nullptr);
            break;
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            if (conv.isImplicit())
                conv.operand().getLongestStaticPrefixes(results, evalContext, longestStaticPrefix);
            break;
        }
        case ExpressionKind::Invalid:
        default:
            break;
    }
}